

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffpdfl(fitsfile *fptr,int *status)

{
  int local_b7c;
  int local_b78;
  int ii;
  int tstatus;
  int nfill;
  LONGLONG fillstart;
  char fill [2880];
  char chfill;
  int *status_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if (fptr->Fptr->heapstart == 0) {
        fptr_local._4_4_ = *status;
      }
      else {
        _tstatus = fptr->Fptr->datastart + fptr->Fptr->heapstart + fptr->Fptr->heapsize;
        ii = (int)((_tstatus + 0xb3f) / 0xb40) * 0xb40 - (int)_tstatus;
        if (ii < 0xb40) {
          if (fptr->Fptr->hdutype == 1) {
            fill[0xb3f] = ' ';
          }
          else {
            fill[0xb3f] = '\0';
          }
          local_b78 = 0;
          if (ii == 0) {
            _tstatus = _tstatus + -1;
            ii = 1;
            ffmbyt(fptr,_tstatus,0,&local_b78);
            ffgbyt(fptr,(long)ii,&fillstart,&local_b78);
            if (local_b78 == 0) {
              return *status;
            }
          }
          else {
            ffmbyt(fptr,_tstatus,0,&local_b78);
            ffgbyt(fptr,(long)ii,&fillstart,&local_b78);
            if (local_b78 == 0) {
              local_b7c = 0;
              while ((local_b7c < ii && (fill[(long)local_b7c + -8] == fill[0xb3f]))) {
                local_b7c = local_b7c + 1;
              }
              if (local_b7c == ii) {
                return *status;
              }
            }
          }
          memset(&fillstart,(uint)(byte)fill[0xb3f],(long)ii);
          ffmbyt(fptr,_tstatus,1,status);
          ffpbyt(fptr,(long)ii,&fillstart,status);
          if (0 < *status) {
            ffpmsg("Error writing Data Unit fill bytes (ffpdfl).");
          }
          fptr_local._4_4_ = *status;
        }
        else {
          *status = 0x108;
          fptr_local._4_4_ = *status;
        }
      }
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpdfl(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Write the Data Unit Fill values if they are not already correct.
  The fill values are used to fill out the last 2880 byte block of the HDU.
  Fill the data unit with zeros or blanks depending on the type of HDU
  from the end of the data to the end of the current FITS 2880 byte block
*/
{
    char chfill, fill[2880];
    LONGLONG fillstart;
    int nfill, tstatus, ii;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        return(*status);      /* fill has already been correctly written */

    if ((fptr->Fptr)->heapstart == 0)
        return(*status);      /* null data unit, so there is no fill */

    fillstart = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart +
                (fptr->Fptr)->heapsize;

    nfill = (long) ((fillstart + 2879) / 2880 * 2880 - fillstart);
    if (nfill >= 2880) /* can only happen if fillstart was negative */
    {
        *status = BAD_HEAP_PTR;
        return (*status);
    }
    
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
        chfill = 32;         /* ASCII tables are filled with spaces */
    else
        chfill = 0;          /* all other extensions are filled with zeros */

    tstatus = 0;

    if (!nfill)  /* no fill bytes; just check that entire table exists */
    {
        fillstart--;
        nfill = 1;
        ffmbyt(fptr, fillstart, REPORT_EOF, &tstatus); /* move to last byte */
        ffgbyt(fptr, nfill, fill, &tstatus);           /* get the last byte */

        if (tstatus == 0)
            return(*status);  /* no EOF error, so everything is OK */
    }
    else
    {
        ffmbyt(fptr, fillstart, REPORT_EOF, &tstatus); /* move to fill area */
        ffgbyt(fptr, nfill, fill, &tstatus);           /* get the fill bytes */

        if (tstatus == 0)
        {
            for (ii = 0; ii < nfill; ii++)
            {
                if (fill[ii] != chfill)
                    break;
            }

            if (ii == nfill)
                return(*status);   /* all the fill values were correct */
        }
    }

    /* fill values are incorrect or have not been written, so write them */

    memset(fill, chfill, nfill);  /* fill the buffer with the fill value */

    ffmbyt(fptr, fillstart, IGNORE_EOF, status); /* move to fill area */
    ffpbyt(fptr, nfill, fill, status); /* write the fill bytes */

    if (*status > 0)
        ffpmsg("Error writing Data Unit fill bytes (ffpdfl).");

    return(*status);
}